

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

mat4 * mat4_shear(mat4 *__return_storage_ptr__,float theta,vec3 a,vec3 b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_48;
  float local_38;
  float fStack_34;
  
  fVar4 = b.z;
  fVar3 = b.y;
  fVar2 = a.z;
  fVar1 = tanf(theta);
  local_38 = a.x;
  fStack_34 = a.y;
  local_48 = b.x;
  __return_storage_ptr__->m[0] = local_38 * local_48 * fVar1 + 1.0;
  __return_storage_ptr__->m[1] = local_38 * fVar3 * fVar1;
  __return_storage_ptr__->m[2] = local_38 * fVar4 * fVar1;
  __return_storage_ptr__->m[3] = 0.0;
  __return_storage_ptr__->m[4] = fStack_34 * local_48 * fVar1;
  __return_storage_ptr__->m[5] = fVar3 * fStack_34 * fVar1 + 1.0;
  __return_storage_ptr__->m[6] = fStack_34 * fVar4 * fVar1;
  __return_storage_ptr__->m[7] = 0.0;
  *(ulong *)(__return_storage_ptr__->m + 8) =
       CONCAT44(fVar1 * fVar2 * fVar3,fVar1 * fVar2 * local_48);
  __return_storage_ptr__->m[10] = fVar4 * fVar2 * fVar1 + 1.0;
  __return_storage_ptr__->m[0xb] = 0.0;
  __return_storage_ptr__->m[0xc] = 0.0;
  __return_storage_ptr__->m[0xd] = 0.0;
  __return_storage_ptr__->m[0xe] = 0.0;
  __return_storage_ptr__->m[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_shear(float theta, vec3 a, vec3 b) {
    float t = tanf(theta);
    return mat4_create(
            a.x * b.x * t + 1.0f, a.x * b.y * t, a.x * b.z * t, 0.0f,
            a.y * b.x * t, a.y * b.y * t + 1.0f, a.y * b.z * t, 0.0f,
            a.z * b.x * t, a.z * b.y * t, a.z * b.z * t + 1.0f, 0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
}